

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O3

PDFFormXObject * __thiscall
TIFFImageHandler::CreateFormXObjectFromTIFFFile
          (TIFFImageHandler *this,string *inTIFFFilePath,ObjectIDType inFormXObjectID,
          TIFFUsageParameters *inTIFFUsageParameters)

{
  EStatusCode EVar1;
  Trace *this_00;
  IByteReaderWithPosition *inTIFFStream;
  PDFFormXObject *pPVar2;
  InputFile tiffFile;
  InputFile IStack_58;
  
  InputFile::InputFile(&IStack_58);
  EVar1 = InputFile::OpenFile(&IStack_58,inTIFFFilePath);
  if (EVar1 == eSuccess) {
    inTIFFStream = InputFile::GetInputStream(&IStack_58);
    pPVar2 = CreateFormXObjectFromTIFFStream
                       (this,inTIFFStream,inFormXObjectID,inTIFFUsageParameters);
  }
  else {
    this_00 = Trace::DefaultTrace();
    pPVar2 = (PDFFormXObject *)0x0;
    Trace::TraceToLog(this_00,
                      "TIFFImageHandler::CreateFormXObjectFromTIFFFile. cannot open file for reading - %s"
                      ,(inTIFFFilePath->_M_dataplus)._M_p);
  }
  InputFile::~InputFile(&IStack_58);
  return pPVar2;
}

Assistant:

PDFFormXObject* TIFFImageHandler::CreateFormXObjectFromTIFFFile(const std::string& inTIFFFilePath,
																ObjectIDType inFormXObjectID,
																const TIFFUsageParameters& inTIFFUsageParameters)

{
	InputFile tiffFile;

	if(tiffFile.OpenFile(inTIFFFilePath) != PDFHummus::eSuccess)
	{
		TRACE_LOG1("TIFFImageHandler::CreateFormXObjectFromTIFFFile. cannot open file for reading - %s",inTIFFFilePath.c_str());
		return NULL;
	}
		
	return CreateFormXObjectFromTIFFStream(tiffFile.GetInputStream(),inFormXObjectID,inTIFFUsageParameters);
}